

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.hpp
# Opt level: O2

int pico_tree::internal::big_endian_to_native<int>(int v)

{
  int native;
  uint uVar1;
  long lVar2;
  byte *pbVar3;
  int v_local;
  
  pbVar3 = (byte *)&v_local;
  v_local = v;
  uVar1 = 0;
  for (lVar2 = 0x18; lVar2 != -8; lVar2 = lVar2 + -8) {
    uVar1 = uVar1 | (uint)*pbVar3 << ((byte)lVar2 & 0x3f);
    pbVar3 = pbVar3 + 1;
  }
  return uVar1;
}

Assistant:

T_ big_endian_to_native(T_ v) {
  static_assert(std::is_integral_v<T_>, "NOT_AN_INTEGRAL_TYPE");
  static_assert(sizeof(T_) <= sizeof(std::size_t), "SIZE_UNSUPPORTED");

  std::byte* v_object = reinterpret_cast<std::byte*>(&v);

  T_ native{};
  for (std::size_t i = 0; i < sizeof(T_); ++i) {
    native |= static_cast<T_>(
        static_cast<std::size_t>(v_object[i]) << ((sizeof(T_) - 1 - i) * 8));
  }

  return native;
}